

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::emit_for_loop_initializers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRBlock *block)

{
  TypedID<(spirv_cross::Types)2> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRVariable *pSVar4;
  ulong uVar5;
  SPIRType *pSVar6;
  int iVar7;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if ((block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
      buffer_size != 0) {
    bVar3 = for_loop_initializers_are_same_type(this,block);
    pTVar1 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
             ptr;
    sVar2 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    iVar7 = 0;
    for (lVar8 = 0; sVar2 << 2 != lVar8; lVar8 = lVar8 + 4) {
      pSVar4 = Compiler::get<spirv_cross::SPIRVariable>
                         (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar8));
      uVar5 = (ulong)(pSVar4->static_expression).id;
      if ((uVar5 == 0) ||
         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar5].type ==
          TypeUndef)) {
        iVar7 = iVar7 + 1;
      }
    }
    sVar2 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    if (sVar2 == 1 && iVar7 == 0) {
      pSVar4 = Compiler::get<spirv_cross::SPIRVariable>
                         (&this->super_Compiler,
                          ((block->loop_variables).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr)->id);
      (*(this->super_Compiler)._vptr_Compiler[0x28])(__return_storage_ptr__,this,pSVar4);
      return __return_storage_ptr__;
    }
    if (bVar3 && iVar7 != (int)sVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      pTVar1 = (block->loop_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      for (lVar8 = 0; sVar2 << 2 != lVar8; lVar8 = lVar8 + 4) {
        pSVar4 = Compiler::get<spirv_cross::SPIRVariable>
                           (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar8));
        uVar5 = (ulong)(pSVar4->static_expression).id;
        if ((uVar5 == 0) ||
           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar5].type ==
            TypeUndef)) {
          pSVar4 = Compiler::get<spirv_cross::SPIRVariable>
                             (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar8));
          (*(this->super_Compiler)._vptr_Compiler[0x28])(&local_70,this,pSVar4);
          statement<std::__cxx11::string,char_const(&)[2]>(this,&local_70,(char (*) [2])0x344fd0);
          this_00 = &local_70;
        }
        else {
          pSVar4 = Compiler::get<spirv_cross::SPIRVariable>
                             (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar8));
          pSVar6 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar4);
          if (__return_storage_ptr__->_M_string_length == 0) {
            (*(this->super_Compiler)._vptr_Compiler[0x33])
                      (&local_50,this,(ulong)(pSVar4->super_IVariant).self.id);
            (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_90,this,pSVar6,0);
            join<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                      (&local_70,(spirv_cross *)&local_50,&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3175f1
                       ,(char (*) [2])in_R8);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_90);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            if (pSVar6->pointer == true) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          }
          (*(this->super_Compiler)._vptr_Compiler[6])
                    (&local_50,this,(ulong)*(uint *)((long)&pTVar1->id + lVar8),1);
          to_pointer_expression_abi_cxx11_(&local_90,this,(pSVar4->static_expression).id,true);
          join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                    (&local_70,(spirv_cross *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34513c,
                     (char (*) [4])&local_90,in_R8);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_90);
          this_00 = &local_50;
        }
        ::std::__cxx11::string::~string((string *)this_00);
      }
      return __return_storage_ptr__;
    }
    pTVar1 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
             ptr;
    for (lVar8 = 0; sVar2 << 2 != lVar8; lVar8 = lVar8 + 4) {
      pSVar4 = Compiler::get<spirv_cross::SPIRVariable>
                         (&this->super_Compiler,*(uint32_t *)((long)&pTVar1->id + lVar8));
      (*(this->super_Compiler)._vptr_Compiler[0x28])(&local_70,this,pSVar4);
      statement<std::__cxx11::string,char_const(&)[2]>(this,&local_70,(char (*) [2])0x344fd0);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::emit_for_loop_initializers(const SPIRBlock &block)
{
	if (block.loop_variables.empty())
		return "";

	bool same_types = for_loop_initializers_are_same_type(block);
	// We can only declare for loop initializers if all variables are of same type.
	// If we cannot do this, declare individual variables before the loop header.

	// We might have a loop variable candidate which was not assigned to for some reason.
	uint32_t missing_initializers = 0;
	for (auto &variable : block.loop_variables)
	{
		uint32_t expr = get<SPIRVariable>(variable).static_expression;

		// Sometimes loop variables are initialized with OpUndef, but we can just declare
		// a plain variable without initializer in this case.
		if (expr == 0 || ir.ids[expr].get_type() == TypeUndef)
			missing_initializers++;
	}

	if (block.loop_variables.size() == 1 && missing_initializers == 0)
	{
		return variable_decl(get<SPIRVariable>(block.loop_variables.front()));
	}
	else if (!same_types || missing_initializers == uint32_t(block.loop_variables.size()))
	{
		for (auto &loop_var : block.loop_variables)
			statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
		return "";
	}
	else
	{
		// We have a mix of loop variables, either ones with a clear initializer, or ones without.
		// Separate the two streams.
		string expr;

		for (auto &loop_var : block.loop_variables)
		{
			uint32_t static_expr = get<SPIRVariable>(loop_var).static_expression;
			if (static_expr == 0 || ir.ids[static_expr].get_type() == TypeUndef)
			{
				statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
			}
			else
			{
				auto &var = get<SPIRVariable>(loop_var);
				auto &type = get_variable_data_type(var);
				if (expr.empty())
				{
					// For loop initializers are of the form <type id = value, id = value, id = value, etc ...
					expr = join(to_qualifiers_glsl(var.self), type_to_glsl(type), " ");
				}
				else
				{
					expr += ", ";
					// In MSL, being based on C++, the asterisk marking a pointer
					// binds to the identifier, not the type.
					if (type.pointer)
						expr += "* ";
				}

				expr += join(to_name(loop_var), " = ", to_pointer_expression(var.static_expression));
			}
		}
		return expr;
	}
}